

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

bool __thiscall Assimp::Importer::IsExtensionSupported(Importer *this,char *szExtension)

{
  BaseImporter *pBVar1;
  char *szExtension_local;
  Importer *this_local;
  
  pBVar1 = GetImporter(this,szExtension);
  return pBVar1 != (BaseImporter *)0x0;
}

Assistant:

bool Importer::IsExtensionSupported(const char* szExtension) const
{
    return nullptr != GetImporter(szExtension);
}